

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

Opnd * __thiscall
GlobOpt::ReplaceWConst<int>(GlobOpt *this,Instr **pInstr,int value,Value **pDstVal)

{
  Instr *pIVar1;
  Opnd *this_00;
  StackSym *this_01;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  IntConstOpnd *newSrc;
  RegOpnd *pRVar3;
  Value *pVVar4;
  ulong value_00;
  
  pIVar1 = *pInstr;
  bVar2 = IR::Opnd::IsUnsigned(pIVar1->m_dst);
  value_00 = (ulong)(uint)value;
  if (!bVar2) {
    value_00 = (long)value;
  }
  newSrc = IR::IntConstOpnd::New(value_00,pIVar1->m_dst->m_type,pIVar1->m_func,false);
  IR::Instr::ReplaceSrc1(*pInstr,&newSrc->super_Opnd);
  IR::Instr::FreeSrc2(*pInstr);
  OptSrc(this,&newSrc->super_Opnd,pInstr,(Value **)0x0,(IndirOpnd *)0x0);
  this_00 = (*pInstr)->m_dst;
  pRVar3 = IR::Opnd::AsRegOpnd(this_00);
  this_01 = pRVar3->m_sym;
  if (((this_01->field_0x18 & 1) != 0) && ((this_01->field_5).m_instrDef != (Instr *)0x0)) {
    StackSym::SetIsIntConst(this_01,(long)value);
  }
  sourceContextId = Func::GetSourceContextId(this->func);
  functionId = Func::GetLocalFunctionId(this->func);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,GlobOptPhase,sourceContextId,functionId);
  if (bVar2) {
    Output::Print(L"TRACE ");
    if (this->prePassLoop != (Loop *)0x0) {
      Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                    (ulong)(this->prePassLoop->loopNumber - 1));
    }
    Output::Print(L": ");
    Output::Print(L"Constant folding to %d: \n",(ulong)(uint)value);
    IR::Instr::Dump(*pInstr);
    Output::Flush();
  }
  pVVar4 = GetIntConstantValue(this,value,*pInstr,this_00);
  *pDstVal = pVVar4;
  return this_00;
}

Assistant:

IR::Opnd* GlobOpt::ReplaceWConst(IR::Instr **pInstr, T value, Value **pDstVal)
{
    IR::Instr * &instr = *pInstr;
    IR::Opnd * constOpnd = CreateIntConstOpnd(instr, value);

    instr->ReplaceSrc1(constOpnd);
    instr->FreeSrc2();

    this->OptSrc(constOpnd, &instr);

    IR::Opnd *dst = instr->GetDst();
    StackSym *dstSym = dst->AsRegOpnd()->m_sym;
    if (dstSym->IsSingleDef())
    {
        SetIsConstFlag(dstSym, value);
    }

    GOPT_TRACE_INSTR(instr, _u("Constant folding to %d: \n"), value);
    *pDstVal = GetIntConstantValue(value, instr, dst);
    return dst;
}